

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

PortHeaderSyntax * __thiscall
slang::parsing::Parser::parsePortHeader(Parser *this,Token constKeyword,Token direction)

{
  Token varKeyword;
  Token direction_00;
  bool bVar1;
  ImplicitTypeSyntax *dataType;
  SyntaxNode *this_00;
  NetPortHeaderSyntax *pNVar2;
  SourceLocation location;
  InterfacePortHeaderSyntax *pIVar3;
  DotMemberClauseSyntax *pDVar4;
  VariablePortHeaderSyntax *pVVar5;
  uint uVar7;
  undefined8 uVar8;
  TokenKind kind;
  Token direction_01;
  Token TVar10;
  SourceRange range;
  Token constKeyword_00;
  InterfacePortHeaderSyntax *header;
  Token local_c0;
  undefined8 local_b0;
  Token local_a8;
  Token local_98;
  Token local_88;
  Token local_78;
  SyntaxList<slang::syntax::VariableDimensionSyntax> local_68;
  undefined8 uVar6;
  Info *pIVar9;
  
  constKeyword_00.info = constKeyword.info;
  uVar8 = constKeyword._0_8_;
  local_c0.info = direction.info;
  local_c0._0_8_ = direction._0_8_;
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  kind = TVar10.kind;
  if (constKeyword_00.info == (Info *)0x0) {
    uVar7 = TVar10._0_4_ & 0xffff;
    bVar1 = slang::syntax::SyntaxFacts::isNetType(kind);
    if (bVar1) {
      TVar10 = ParserBase::consume(&this->super_ParserBase);
      this_00 = (SyntaxNode *)parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x1);
      if (((TVar10._0_4_ & 0xffff) == 199) &&
         ((this_00->kind != ImplicitType || (this_00[1].parent != (SyntaxNode *)0x0)))) {
        range = slang::syntax::SyntaxNode::sourceRange(this_00);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x660005,range);
      }
      direction_00.info = local_c0.info;
      direction_00.kind = local_c0.kind;
      direction_00._2_1_ = local_c0._2_1_;
      direction_00.numFlags.raw = local_c0.numFlags.raw;
      direction_00.rawLen = local_c0.rawLen;
      pNVar2 = slang::syntax::SyntaxFactory::netPortHeader
                         (&this->factory,direction_00,TVar10,(DataTypeSyntax *)this_00);
      return &pNVar2->super_PortHeaderSyntax;
    }
    if (kind != Identifier) {
      if (uVar7 != 0x143) {
        if (uVar7 == 200) {
          if (local_c0.info != (Info *)0x0) {
            location = Token::location(&local_c0);
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x210005,location);
          }
          TVar10 = ParserBase::consume(&this->super_ParserBase);
          pDVar4 = parseDotMemberClause(this);
          pIVar3 = slang::syntax::SyntaxFactory::interfacePortHeader(&this->factory,TVar10,pDVar4);
          return &pIVar3->super_PortHeaderSyntax;
        }
        goto LAB_0039ffdc;
      }
      goto LAB_0039fde1;
    }
  }
  else if (kind != Identifier) {
    if ((TVar10._0_4_ & 0xffff) != 0x143) {
LAB_0039ffdc:
      pIVar9 = local_c0.info;
      uVar6 = local_c0._0_8_;
      Token::Token(&local_98);
      dataType = (ImplicitTypeSyntax *)
                 parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x1);
      local_88._0_8_ = local_98._0_8_;
      local_88.info = local_98.info;
      goto LAB_003a00e3;
    }
LAB_0039fde1:
    local_a8 = ParserBase::consume(&this->super_ParserBase);
    pIVar9 = local_c0.info;
    uVar6 = local_c0._0_8_;
    dataType = (ImplicitTypeSyntax *)
               parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x1);
    local_88._0_8_ = local_a8._0_8_;
    local_88.info = local_a8.info;
    goto LAB_003a00e3;
  }
  if ((((constKeyword_00.info == (Info *)0x0) &&
       (TVar10 = ParserBase::peek(&this->super_ParserBase,1), TVar10.kind == Dot)) &&
      (TVar10 = ParserBase::peek(&this->super_ParserBase,2), TVar10.kind == Identifier)) &&
     (TVar10 = ParserBase::peek(&this->super_ParserBase,3), TVar10.kind == Identifier)) {
    TVar10 = ParserBase::consume(&this->super_ParserBase);
    pDVar4 = parseDotMemberClause(this);
    local_68.super_SyntaxListBase._vptr_SyntaxListBase =
         (_func_int **)
         slang::syntax::SyntaxFactory::interfacePortHeader(&this->factory,TVar10,pDVar4);
    std::
    vector<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
    ::push_back(&(this->meta).interfacePorts,(value_type *)&local_68);
    return &((InterfacePortHeaderSyntax *)local_68.super_SyntaxListBase._vptr_SyntaxListBase)->
            super_PortHeaderSyntax;
  }
  bVar1 = isPlainPortName(this);
  local_b0 = uVar8;
  if (bVar1) {
    Token::Token(&local_78);
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.childCount = 0;
    local_68.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)0x0;
    local_68.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = 0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d28d8;
    TVar10 = ParserBase::placeholderToken(&this->super_ParserBase);
    dataType = slang::syntax::SyntaxFactory::implicitType(&this->factory,local_78,&local_68,TVar10);
  }
  else {
    dataType = (ImplicitTypeSyntax *)
               parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x0);
  }
  pIVar9 = local_c0.info;
  uVar6 = local_c0._0_8_;
  Token::Token(&local_88);
  uVar8 = local_b0;
LAB_003a00e3:
  varKeyword.info = local_88.info;
  varKeyword.kind = local_88.kind;
  varKeyword._2_1_ = local_88._2_1_;
  varKeyword.numFlags.raw = local_88.numFlags.raw;
  varKeyword.rawLen = local_88.rawLen;
  direction_01.info = pIVar9;
  direction_01.kind = (TokenKind)uVar6;
  direction_01._2_1_ = SUB81(uVar6,2);
  direction_01.numFlags.raw = SUB81(uVar6,3);
  direction_01.rawLen = SUB84(uVar6,4);
  constKeyword_00.kind = (short)uVar8;
  constKeyword_00._2_1_ = (char)((ulong)uVar8 >> 0x10);
  constKeyword_00.numFlags.raw = (char)((ulong)uVar8 >> 0x18);
  constKeyword_00.rawLen = (int)((ulong)uVar8 >> 0x20);
  pVVar5 = slang::syntax::SyntaxFactory::variablePortHeader
                     (&this->factory,constKeyword_00,direction_01,varKeyword,
                      &dataType->super_DataTypeSyntax);
  return &pVVar5->super_PortHeaderSyntax;
}

Assistant:

PortHeaderSyntax& Parser::parsePortHeader(Token constKeyword, Token direction) {
    auto kind = peek().kind;

    if (!constKeyword) {
        if (isNetType(kind)) {
            auto netType = consume();
            auto& dataType = parseDataType(TypeOptions::AllowImplicit);

            if (netType.kind == TokenKind::InterconnectKeyword &&
                (dataType.kind != SyntaxKind::ImplicitType ||
                 dataType.as<ImplicitTypeSyntax>().signing)) {
                addDiag(diag::InterconnectTypeSyntax, dataType.sourceRange());
            }

            return factory.netPortHeader(direction, netType, dataType);
        }

        if (kind == TokenKind::InterfaceKeyword) {
            if (direction)
                addDiag(diag::DirectionOnInterfacePort, direction.location());

            auto keyword = consume();
            return factory.interfacePortHeader(keyword, parseDotMemberClause());
        }
    }

    if (kind == TokenKind::VarKeyword) {
        auto varKeyword = consume();
        return factory.variablePortHeader(constKeyword, direction, varKeyword,
                                          parseDataType(TypeOptions::AllowImplicit));
    }

    if (kind == TokenKind::Identifier) {
        // could be a bunch of different things here; scan ahead to see
        if (!constKeyword && peek(1).kind == TokenKind::Dot &&
            peek(2).kind == TokenKind::Identifier && peek(3).kind == TokenKind::Identifier) {
            auto name = consume();
            InterfacePortHeaderSyntax* header =
                &factory.interfacePortHeader(name, parseDotMemberClause());
            meta.interfacePorts.push_back(header);
            return *header;
        }

        DataTypeSyntax* type;
        if (!isPlainPortName())
            type = &parseDataType();
        else
            type = &factory.implicitType(Token(), nullptr, placeholderToken());

        return factory.variablePortHeader(constKeyword, direction, Token(), *type);
    }

    // assume we have some kind of data type here
    return factory.variablePortHeader(constKeyword, direction, Token(),
                                      parseDataType(TypeOptions::AllowImplicit));
}